

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_accents.cpp
# Opt level: O2

string_t __thiscall
duckdb::StripAccentsOperator::Operation<duckdb::string_t,duckdb::string_t>
          (StripAccentsOperator *this,string_t input,Vector *result)

{
  bool bVar1;
  utf8proc_uint8_t *puVar2;
  string_t sVar4;
  undefined8 local_38;
  utf8proc_uint8_t *local_30;
  utf8proc_uint8_t *puVar3;
  
  puVar3 = input.value._0_8_;
  puVar2 = (utf8proc_uint8_t *)((long)&local_38 + 4);
  if (0xc < (uint)this) {
    puVar2 = puVar3;
  }
  local_38 = this;
  local_30 = puVar3;
  bVar1 = IsAscii((char *)puVar2,(ulong)this & 0xffffffff);
  if (!bVar1) {
    puVar2 = utf8proc_remove_accents(puVar2,(ulong)this & 0xffffffff);
    sVar4 = StringVector::AddString(input.value._8_8_,(char *)puVar2);
    puVar3 = sVar4.value._8_8_;
    this = sVar4.value._0_8_;
    free(puVar2);
  }
  sVar4.value.pointer.ptr = (char *)puVar3;
  sVar4.value._0_8_ = this;
  return (string_t)sVar4.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		if (IsAscii(input.GetData(), input.GetSize())) {
			return input;
		}

		// non-ascii, perform collation
		auto stripped = utf8proc_remove_accents((const utf8proc_uint8_t *)input.GetData(),
		                                        UnsafeNumericCast<utf8proc_ssize_t>(input.GetSize()));
		auto result_str = StringVector::AddString(result, const_char_ptr_cast(stripped));
		free(stripped);
		return result_str;
	}